

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlanningUnitMADPDiscrete.cpp
# Opt level: O2

Index __thiscall
PlanningUnitMADPDiscrete::GetTimeStepForJOHI(PlanningUnitMADPDiscrete *this,Index johI)

{
  Index IVar1;
  JointObservationHistoryTree *pJVar2;
  ulong uVar3;
  
  if ((this->_m_params)._m_jointObservationHistories == true) {
    pJVar2 = GetJointObservationHistoryTree(this,johI);
    IVar1 = (Index)(((pJVar2->super_TreeNode<JointObservationHistory>)._m_containedElem)->
                   super_JointHistory).super_History._m_length;
  }
  else {
    uVar3 = 0xffffffffffffffff;
    do {
      IVar1 = (Index)uVar3;
      uVar3 = (ulong)(IVar1 + 1);
      if ((this->super_PlanningUnit)._m_horizon <= uVar3) {
        return IVar1;
      }
    } while ((this->_m_firstJOHIforT).
             super__Vector_base<unsigned_long_long,_std::allocator<unsigned_long_long>_>._M_impl.
             super__Vector_impl_data._M_start[uVar3] <= (ulong)johI);
  }
  return IVar1;
}

Assistant:

Index PlanningUnitMADPDiscrete::GetTimeStepForJOHI(Index johI) const
{
    if(_m_params.GetComputeJointObservationHistories())
        return(GetJointObservationHistoryTree(johI)->GetContainedElement()->
                GetLength() );

    //else... find out what time step this is a joh for
    Index t = 0;
    size_t h=GetHorizon();
    while(  t < h && _m_firstJOHIforT[t] <= johI )
        t++;

    //  _m_firstJOHIforT[t] > johI  OR t==GetHorizon
    if(t == h)
        t--; //last time step is h-1
    else
        t--;//_m_nrJointObservationHistoriesT[t] > johI so johI belongs to 
            //previous time step.
    return(t);
}